

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall
t_py_generator::generate_deserialize_set_element
          (t_py_generator *this,ostream *out,t_set *tset,string *prefix)

{
  t_type *type;
  ostream *poVar1;
  string elem;
  t_field felem;
  allocator local_151;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  t_field local_d0;
  
  std::__cxx11::string::string((string *)&local_f0,"_elem",(allocator *)&local_d0);
  t_generator::tmp(&local_150,&this->super_t_generator,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  type = tset->elem_type_;
  std::__cxx11::string::string((string *)&local_110,(string *)&local_150);
  t_field::t_field(&local_d0,type,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"",&local_151);
  generate_deserialize_field(this,out,&local_d0,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  poVar1 = t_generator::indent(&this->super_t_generator,out);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,".add(");
  poVar1 = std::operator<<(poVar1,(string *)&local_150);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_field::~t_field(&local_d0);
  std::__cxx11::string::~string((string *)&local_150);
  return;
}

Assistant:

void t_py_generator::generate_deserialize_set_element(ostream& out, t_set* tset, string prefix) {
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);

  generate_deserialize_field(out, &felem);

  indent(out) << prefix << ".add(" << elem << ")" << endl;
}